

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_two_connects.c
# Opt level: O0

void client_socket_close_hook(cio_socket *socket)

{
  cio_address_family address_family;
  undefined1 local_9c [8];
  cio_socket_address client_endpoint;
  cio_error err;
  cio_inet_address inet_address;
  cio_socket *socket_local;
  
  client_endpoint.impl.sa._104_4_ =
       cio_init_inet_address
                 ((cio_inet_address *)(client_endpoint.impl.sa.unix_address.un.sun_path + 0x6a),
                  "\x7f",4);
  if (client_endpoint.impl.sa._104_4_ == CIO_SUCCESS) {
    client_endpoint.impl.sa._104_4_ =
         cio_init_inet_socket_address
                   ((cio_socket_address *)local_9c,
                    (cio_inet_address *)(client_endpoint.impl.sa.unix_address.un.sun_path + 0x6a),
                    0x3039);
    if (client_endpoint.impl.sa._104_4_ == CIO_SUCCESS) {
      address_family = cio_socket_address_get_family((cio_socket_address *)local_9c);
      client_endpoint.impl.sa._104_4_ =
           cio_socket_init(&second_client_socket,address_family,&loop,1000000000,
                           second_client_socket_close_hook);
      if (client_endpoint.impl.sa._104_4_ == CIO_SUCCESS) {
        client_endpoint.impl.sa._104_4_ = cio_socket_set_tcp_fast_open(&second_client_socket,true);
        if (client_endpoint.impl.sa._104_4_ == CIO_SUCCESS) {
          client_endpoint.impl.sa._104_4_ =
               cio_socket_connect(&second_client_socket,(cio_socket_address *)local_9c,
                                  handle_connect,&second_client);
          if (client_endpoint.impl.sa._104_4_ == CIO_SUCCESS) {
            return;
          }
          fprintf(_stderr,"second client could not connect to server!\n");
        }
        else {
          fprintf(_stderr,"could not enable TCP FASTOPEN for active (connect) socket!\n");
        }
        cio_socket_close(&second_client_socket);
      }
      else {
        fprintf(_stderr,"could not init client socket endpoint!\n");
      }
    }
    else {
      fprintf(_stderr,"could not init second client socket endpoint!\n");
    }
  }
  else {
    fprintf(_stderr,"could not init second client socket inet address!\n");
  }
  cio_eventloop_cancel(&loop);
  return;
}

Assistant:

static void client_socket_close_hook(struct cio_socket *socket)
{
	(void)socket;

	static const uint8_t IP[4] = {127, 0, 0, 1};
	struct cio_inet_address inet_address;
	enum cio_error err = cio_init_inet_address(&inet_address, IP, sizeof(IP));
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not init second client socket inet address!\n");
		goto err;
	}

	struct cio_socket_address client_endpoint;
	err = cio_init_inet_socket_address(&client_endpoint, &inet_address, SERVERSOCKET_LISTEN_PORT);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not init second client socket endpoint!\n");
		goto err;
	}

	err = cio_socket_init(&second_client_socket, cio_socket_address_get_family(&client_endpoint), &loop, CLOSE_TIMEOUT_NS, second_client_socket_close_hook);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not init client socket endpoint!\n");
		goto err;
	}

	err = cio_socket_set_tcp_fast_open(&second_client_socket, true);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "could not enable TCP FASTOPEN for active (connect) socket!\n");
		goto client_socket_close;
	}

	err = cio_socket_connect(&second_client_socket, &client_endpoint, handle_connect, &second_client);
	if (err != CIO_SUCCESS) {
		(void)fprintf(stderr, "second client could not connect to server!\n");
		goto client_socket_close;
	}

	return;

client_socket_close:
	cio_socket_close(&second_client_socket);
err:
	cio_eventloop_cancel(&loop);
}